

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

optional<Vault::AuthenticationResponse> * __thiscall
SuccessfulAuth::authenticate
          (optional<Vault::AuthenticationResponse> *__return_storage_ptr__,SuccessfulAuth *this,
          Client *client)

{
  allocator<char> local_9a;
  allocator<char> local_99;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  size_type local_90;
  char local_88 [8];
  undefined8 uStack_80;
  AuthenticationResponse local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  size_type local_30;
  char local_28 [8];
  undefined8 uStack_20;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_99);
  local_78.rawResponse.value_._M_dataplus._M_p = (pointer)&local_78.rawResponse.value_.field_2;
  if (local_98 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88) {
    local_78.rawResponse.value_.field_2._8_8_ = uStack_80;
  }
  else {
    local_78.rawResponse.value_._M_dataplus._M_p = (pointer)local_98;
  }
  local_78.rawResponse.value_._M_string_length = local_90;
  local_90 = 0;
  local_88[0] = '\0';
  local_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_88;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"success",&local_9a);
  local_78.token.value_._M_dataplus._M_p = (pointer)&local_78.token.value_.field_2;
  if (local_38 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28) {
    local_78.token.value_.field_2._8_8_ = uStack_20;
  }
  else {
    local_78.token.value_._M_dataplus._M_p = (pointer)local_38;
  }
  local_78.token.value_._M_string_length = local_30;
  local_30 = 0;
  local_28[0] = '\0';
  local_38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_28;
  Catch::clara::std::optional<Vault::AuthenticationResponse>::
  optional<Vault::AuthenticationResponse,_true>(__return_storage_ptr__,&local_78);
  Vault::AuthenticationResponse::~AuthenticationResponse(&local_78);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_98);
  return __return_storage_ptr__;
}

Assistant:

std::optional<Vault::AuthenticationResponse>
  authenticate(const Vault::Client &client) override {
    return std::optional<Vault::AuthenticationResponse>(
        {Vault::HttpResponseBodyString{""}, Vault::Token{"success"}});
  }